

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QString * __thiscall
QTzTimeZonePrivate::displayName
          (QTzTimeZonePrivate *this,TimeType timeType,NameType nameType,QLocale *locale)

{
  long lVar1;
  bool bVar2;
  undefined1 *puVar3;
  int in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  QString *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  TimeType in_stack_0000001c;
  QTzTimeZonePrivate *in_stack_00000020;
  Data tran;
  QString *in_stack_ffffffffffffff58;
  QTzTimeZonePrivate *in_stack_ffffffffffffff60;
  QLocale *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ECX != 1) &&
     (bVar2 = isDataLocale(in_stack_ffffffffffffff60,(QLocale *)in_stack_ffffffffffffff58), bVar2))
  {
    data(in_stack_00000020,in_stack_0000001c);
    puVar3 = (undefined1 *)QTimeZonePrivate::invalidMSecs();
    if (puVar3 == &DAT_aaaaaaaaaaaaaaaa) {
LAB_0074c843:
      bVar2 = false;
    }
    else if (in_ECX == 2) {
      QString::QString((QString *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      bVar2 = true;
    }
    else {
      bVar2 = QTimeZonePrivate::isAnglicLocale((QLocale *)in_stack_ffffffffffffff60);
      if (!bVar2) goto LAB_0074c843;
      QTimeZonePrivate::isoOffsetFormat((int)((ulong)in_RSI >> 0x20),(NameType)in_RSI);
      bVar2 = true;
    }
    QTimeZonePrivate::Data::~Data((Data *)0x74c855);
    if (bVar2) goto LAB_0074c87f;
  }
  QTimeZonePrivate::displayName
            ((QTimeZonePrivate *)CONCAT44(in_EDX,in_ECX),(TimeType)((ulong)in_R8 >> 0x20),
             (NameType)in_R8,in_stack_ffffffffffffffa0);
LAB_0074c87f:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QTzTimeZonePrivate::displayName(QTimeZone::TimeType timeType,
                                        QTimeZone::NameType nameType,
                                        const QLocale &locale) const
{
    // TZ only provides C-locale abbreviations and offset:
    if (nameType != QTimeZone::LongName && isDataLocale(locale)) {
        Data tran = data(timeType);
        if (tran.atMSecsSinceEpoch != invalidMSecs()) {
            if (nameType == QTimeZone::ShortName)
                return tran.abbreviation;
            // Save base class repeating the data(timeType) query:
            if (isAnglicLocale(locale))
                return isoOffsetFormat(tran.offsetFromUtc);
        }
    }
    // Otherwise, fall back to base class (and qtimezonelocale.cpp):
    return QTimeZonePrivate::displayName(timeType, nameType, locale);
}